

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_operator_expression.cpp
# Opt level: O1

LogicalType * __thiscall
duckdb::ExpressionBinder::ResolveNotType
          (LogicalType *__return_storage_ptr__,ExpressionBinder *this,OperatorExpression *op,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *children)

{
  ClientContext *context;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  undefined1 auVar2 [8];
  reference pvVar3;
  undefined1 local_40 [8];
  _Head_base<0UL,_duckdb::Expression_*,_false> local_38;
  LogicalType local_30;
  
  context = this->context;
  pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](children,0);
  local_38._M_head_impl =
       (pvVar3->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
       .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar3->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  LogicalType::LogicalType(&local_30,BOOLEAN);
  BoundCastExpression::AddCastToType
            ((BoundCastExpression *)local_40,context,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_38,&local_30,false);
  pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](children,0);
  auVar2 = local_40;
  local_40 = (undefined1  [8])0x0;
  _Var1._M_head_impl =
       (pvVar3->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
       .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar3->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)auVar2;
  if (_Var1._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
  }
  if (local_40 != (undefined1  [8])0x0) {
    (**(code **)(*(_func_int **)local_40 + 8))();
  }
  local_40 = (undefined1  [8])0x0;
  LogicalType::~LogicalType(&local_30);
  if (local_38._M_head_impl != (Expression *)0x0) {
    (*((local_38._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_38._M_head_impl = (Expression *)0x0;
  LogicalType::LogicalType(__return_storage_ptr__,BOOLEAN);
  return __return_storage_ptr__;
}

Assistant:

LogicalType ExpressionBinder::ResolveNotType(OperatorExpression &op, vector<unique_ptr<Expression>> &children) {
	// NOT expression, cast child to BOOLEAN
	D_ASSERT(children.size() == 1);
	children[0] = BoundCastExpression::AddCastToType(context, std::move(children[0]), LogicalType::BOOLEAN);
	return LogicalType(LogicalTypeId::BOOLEAN);
}